

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O2

void __thiscall
Assimp::X3DImporter::MeshGeometry_AddColor
          (X3DImporter *this,aiMesh *pMesh,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pColors,bool pColorPerVertex)

{
  undefined8 *puVar1;
  uint uVar2;
  uint uVar3;
  _List_node_base *p_Var4;
  _List_node_base *p_Var5;
  size_t fi;
  aiColor4D *paVar6;
  long lVar7;
  DeadlyImportError *pDVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  ulong uVar10;
  _Self __tmp;
  _List_node_base *p_Var11;
  string local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  p_Var11 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
            _M_impl._M_node.super__List_node_base._M_next;
  uVar9 = (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
          _M_node._M_size;
  if ((int)CONCAT71(in_register_00000009,pColorPerVertex) == 0) {
    uVar10 = (ulong)pMesh->mNumFaces;
    if (uVar9 < uVar10) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_d0,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_b0,"MeshGeometry_AddColor1. Colors count(",&local_d0);
      std::operator+(&local_90,&local_b0,") can not be less than Faces count(");
      to_string<unsigned_int>(&local_f0,pMesh->mNumFaces);
      std::operator+(&local_70,&local_90,&local_f0);
      std::operator+(&local_50,&local_70,").");
      DeadlyImportError::DeadlyImportError(pDVar8,&local_50);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar2 = pMesh->mNumVertices;
    uVar9 = (ulong)uVar2 << 4;
    paVar6 = (aiColor4D *)operator_new__(uVar9);
    if ((ulong)uVar2 != 0) {
      memset(paVar6,0,uVar9);
    }
    pMesh->mColors[0] = paVar6;
    for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
      uVar2 = pMesh->mFaces[uVar9].mNumIndices;
      for (uVar10 = 0; uVar2 != uVar10; uVar10 = uVar10 + 1) {
        paVar6 = pMesh->mColors[0];
        uVar3 = pMesh->mFaces[uVar9].mIndices[uVar10];
        p_Var5 = p_Var11[1]._M_prev;
        *(_List_node_base **)(paVar6 + uVar3) = p_Var11[1]._M_next;
        *(_List_node_base **)&paVar6[uVar3].b = p_Var5;
      }
      p_Var11 = p_Var11->_M_next;
      uVar10 = (ulong)pMesh->mNumFaces;
    }
  }
  else {
    uVar2 = pMesh->mNumVertices;
    uVar10 = (ulong)uVar2;
    if (uVar9 < uVar10) {
      pDVar8 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      to_string<unsigned_long>
                (&local_d0,
                 (pColors->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
                 _M_impl._M_node._M_size);
      std::operator+(&local_b0,"MeshGeometry_AddColor1. Colors count(",&local_d0);
      std::operator+(&local_90,&local_b0,") can not be less than Vertices count(");
      to_string<unsigned_int>(&local_f0,pMesh->mNumVertices);
      std::operator+(&local_70,&local_90,&local_f0);
      std::operator+(&local_50,&local_70,").");
      DeadlyImportError::DeadlyImportError(pDVar8,&local_50);
      __cxa_throw(pDVar8,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    paVar6 = (aiColor4D *)operator_new__(uVar10 << 4);
    if (uVar2 != 0) {
      memset(paVar6,0,uVar10 << 4);
    }
    pMesh->mColors[0] = paVar6;
    lVar7 = 0;
    for (uVar9 = 0; uVar9 < uVar10; uVar9 = uVar9 + 1) {
      p_Var5 = p_Var11 + 1;
      p_Var4 = p_Var11[1]._M_prev;
      p_Var11 = p_Var11->_M_next;
      puVar1 = (undefined8 *)((long)&pMesh->mColors[0]->r + lVar7);
      *puVar1 = p_Var5->_M_next;
      puVar1[1] = p_Var4;
      uVar10 = (ulong)pMesh->mNumVertices;
      lVar7 = lVar7 + 0x10;
    }
  }
  return;
}

Assistant:

void X3DImporter::MeshGeometry_AddColor(aiMesh& pMesh, const std::list<aiColor4D>& pColors, const bool pColorPerVertex) const
{
    std::list<aiColor4D>::const_iterator col_it = pColors.begin();

	if(pColorPerVertex)
	{
		if(pColors.size() < pMesh.mNumVertices)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Vertices count(" +
									to_string(pMesh.mNumVertices) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t i = 0; i < pMesh.mNumVertices; i++) pMesh.mColors[0][i] = *col_it++;
	}// if(pColorPerVertex)
	else
	{
		if(pColors.size() < pMesh.mNumFaces)
		{
			throw DeadlyImportError("MeshGeometry_AddColor1. Colors count(" + to_string(pColors.size()) + ") can not be less than Faces count(" +
									to_string(pMesh.mNumFaces) +  ").");
		}

		// copy colors to mesh
		pMesh.mColors[0] = new aiColor4D[pMesh.mNumVertices];
		for(size_t fi = 0; fi < pMesh.mNumFaces; fi++)
		{
			// apply color to all vertices of face
            for ( size_t vi = 0, vi_e = pMesh.mFaces[ fi ].mNumIndices; vi < vi_e; vi++ )
            {
                pMesh.mColors[ 0 ][ pMesh.mFaces[ fi ].mIndices[ vi ] ] = *col_it;
            }

			++col_it;
		}
	}// if(pColorPerVertex) else
}